

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.cc
# Opt level: O3

void __thiscall AddrSpaceManager::~AddrSpaceManager(AddrSpaceManager *this)

{
  AddrSpace *pAVar1;
  JoinRecord *pJVar2;
  pointer pVVar3;
  pointer ppAVar4;
  pointer ppAVar5;
  pointer ppAVar6;
  pointer ppJVar7;
  pointer ppAVar8;
  ulong uVar9;
  
  this->_vptr_AddrSpaceManager = (_func_int **)&PTR__AddrSpaceManager_003bda48;
  ppAVar4 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppAVar8 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppAVar8 != ppAVar4; ppAVar8 = ppAVar8 + 1
      ) {
    pAVar1 = *ppAVar8;
    if (pAVar1 != (AddrSpace *)0x0) {
      if (pAVar1->refcount < 2) {
        (*pAVar1->_vptr_AddrSpace[1])();
        ppAVar4 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pAVar1->refcount = pAVar1->refcount + -1;
      }
    }
  }
  ppAVar5 = (this->resolvelist).
            super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar6 = (this->resolvelist).
            super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar6 != ppAVar5) {
    uVar9 = 0;
    do {
      if (ppAVar5[uVar9] != (AddressResolver *)0x0) {
        (*ppAVar5[uVar9]->_vptr_AddressResolver[1])();
        ppAVar5 = (this->resolvelist).
                  super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar6 = (this->resolvelist).
                  super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)ppAVar6 - (long)ppAVar5 >> 3));
  }
  ppJVar7 = (this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar7) {
    uVar9 = 0;
    do {
      pJVar2 = ppJVar7[uVar9];
      if ((pJVar2 != (JoinRecord *)0x0) &&
         (pVVar3 = (pJVar2->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                   _M_impl.super__Vector_impl_data._M_start, pVVar3 != (pointer)0x0)) {
        operator_delete(pVVar3);
      }
      operator_delete(pJVar2);
      uVar9 = uVar9 + 1;
      ppJVar7 = (this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->splitlist).
                                   super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppJVar7 >> 3));
  }
  if (ppJVar7 != (pointer)0x0) {
    operator_delete(ppJVar7);
  }
  std::
  _Rb_tree<JoinRecord_*,_JoinRecord_*,_std::_Identity<JoinRecord_*>,_JoinRecordCompare,_std::allocator<JoinRecord_*>_>
  ::~_Rb_tree(&(this->splitset)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_AddrSpace_*>,_std::_Select1st<std::pair<const_int,_AddrSpace_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->shortcut2Space)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->name2Space)._M_t);
  ppAVar5 = (this->resolvelist).
            super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar5 != (pointer)0x0) {
    operator_delete(ppAVar5);
  }
  ppAVar8 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar8 != (pointer)0x0) {
    operator_delete(ppAVar8);
    return;
  }
  return;
}

Assistant:

AddrSpaceManager::~AddrSpaceManager(void)

{
  for(vector<AddrSpace *>::iterator iter=baselist.begin();iter!=baselist.end();++iter) {
    AddrSpace *spc = *iter;
    if (spc == (AddrSpace *)0) continue;
    if (spc->refcount > 1)
      spc->refcount -= 1;
    else
      delete spc;
  }
  for(int4 i=0;i<resolvelist.size();++i) {
    if (resolvelist[i] != (AddressResolver *)0)
      delete resolvelist[i];
  }
  for(int4 i=0;i<splitlist.size();++i)
    delete splitlist[i];	// Delete any join records
}